

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O1

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 __thiscall
duckdb::ArrowTableFunction::ArrowScanInitLocalInternal
          (ArrowTableFunction *this,ClientContext *context,TableFunctionInitInput *input,
          GlobalTableFunctionState *global_state_p)

{
  TableFilterSet *pTVar1;
  pointer puVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __uniq_ptr_impl<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_> _Var4;
  bool bVar5;
  _Tuple_impl<0UL,_duckdb::ArrowScanLocalState_*,_std::default_delete<duckdb::ArrowScanLocalState>_>
  this_00;
  pointer pAVar6;
  type state;
  _Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false> _Var7;
  ClientContext *__x;
  ClientContext *context_00;
  ArrowScanGlobalState *asgs;
  templated_unique_single_t result;
  templated_unique_single_t current_chunk;
  _Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false> local_40;
  _Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false> local_38;
  _Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false> local_30;
  
  local_38._M_head_impl = (ArrowArrayWrapper *)operator_new(0x50);
  ((local_38._M_head_impl)->arrow_array).length = 0;
  ((local_38._M_head_impl)->arrow_array).release = (_func_void_ArrowArray_ptr *)0x0;
  this_00.super__Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>)operator_new(200);
  local_30._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ArrowArrayWrapper *)0x0;
  ArrowScanLocalState::ArrowScanLocalState
            ((ArrowScanLocalState *)
             this_00.super__Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>._M_head_impl,
             (unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
              *)&stack0xffffffffffffffd0,context);
  _Var4._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowArrayWrapper_*,_std::default_delete<duckdb::ArrowArrayWrapper>_>
  .super__Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false>._M_head_impl =
       (tuple<duckdb::ArrowArrayWrapper_*,_std::default_delete<duckdb::ArrowArrayWrapper>_>)
       (tuple<duckdb::ArrowArrayWrapper_*,_std::default_delete<duckdb::ArrowArrayWrapper>_>)
       local_30._M_head_impl;
  local_40._M_head_impl =
       (ArrowScanLocalState *)
       this_00.super__Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_>)
      local_30._M_head_impl !=
      (__uniq_ptr_impl<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_>)
      0x0) {
    ArrowArrayWrapper::~ArrowArrayWrapper(local_30._M_head_impl);
    operator_delete((void *)_Var4._M_t.
                            super__Tuple_impl<0UL,_duckdb::ArrowArrayWrapper_*,_std::default_delete<duckdb::ArrowArrayWrapper>_>
                            .super__Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false>._M_head_impl)
    ;
  }
  pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                         *)&stack0xffffffffffffffc0);
  __x = (ClientContext *)&input->column_ids;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
  pTVar1 = (input->filters).ptr;
  pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                         *)&stack0xffffffffffffffc0);
  pAVar6->filters = pTVar1;
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  if (*(char *)&(input->bind_data).ptr[0x1d]._vptr_FunctionData == '\0') {
    pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                           *)&stack0xffffffffffffffc0);
    puVar2 = (pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (pAVar6->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
  }
  else if ((input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    pAVar6 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                           *)&stack0xffffffffffffffc0);
    DataChunk::Initialize
              (&pAVar6->all_columns,context,
               (vector<duckdb::LogicalType,_true> *)(global_state_p + 0xd),0x800);
    __x = context;
  }
  context_00 = (ClientContext *)&stack0xffffffffffffffc0;
  state = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
          ::operator*((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                       *)context_00);
  bVar5 = ArrowScanParallelStateNext
                    (context_00,(FunctionData *)__x,state,(ArrowScanGlobalState *)global_state_p);
  _Var7._M_head_impl = local_40._M_head_impl;
  if (bVar5) {
    local_40._M_head_impl = (ArrowScanLocalState *)0x0;
  }
  else {
    *(undefined8 *)this = 0;
    _Var7._M_head_impl = (ArrowScanLocalState *)0x0;
  }
  *(ArrowScanLocalState **)this = _Var7._M_head_impl;
  if (local_40._M_head_impl != (ArrowScanLocalState *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ArrowArrayWrapper::~ArrowArrayWrapper(local_38._M_head_impl);
    operator_delete(_Var3._M_pi);
  }
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<LocalTableFunctionState>
ArrowTableFunction::ArrowScanInitLocalInternal(ClientContext &context, TableFunctionInitInput &input,
                                               GlobalTableFunctionState *global_state_p) {
	auto &global_state = global_state_p->Cast<ArrowScanGlobalState>();
	auto current_chunk = make_uniq<ArrowArrayWrapper>();
	auto result = make_uniq<ArrowScanLocalState>(std::move(current_chunk), context);
	result->column_ids = input.column_ids;
	result->filters = input.filters.get();
	auto &bind_data = input.bind_data->Cast<ArrowScanFunctionData>();
	if (!bind_data.projection_pushdown_enabled) {
		result->column_ids.clear();
	} else if (!input.projection_ids.empty()) {
		auto &asgs = global_state_p->Cast<ArrowScanGlobalState>();
		result->all_columns.Initialize(context, asgs.scanned_types);
	}
	if (!ArrowScanParallelStateNext(context, input.bind_data.get(), *result, global_state)) {
		return nullptr;
	}
	return std::move(result);
}